

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O3

SQRESULT sq_stackinfos(HSQUIRRELVM v,SQInteger level,SQStackInfos *si)

{
  CallInfo *pCVar1;
  SQObjectType SVar2;
  long lVar3;
  SQFunctionProto *this;
  SQNativeClosure *pSVar4;
  SQInteger SVar5;
  
  lVar3 = v->_callsstacksize;
  if (lVar3 <= level) {
    return -1;
  }
  si->funcname = (SQChar *)0x0;
  si->source = (SQChar *)0x0;
  si->line = 0;
  pCVar1 = v->_callsstack + lVar3 + ~level;
  SVar2 = (pCVar1->_closure).super_SQObject._type;
  if (SVar2 == OT_NATIVECLOSURE) {
    si->source = "NATIVE";
    si->funcname = "unknown";
    pSVar4 = (pCVar1->_closure).super_SQObject._unVal.pNativeClosure;
    SVar5 = -1;
    if ((pSVar4->_name).super_SQObject._type == OT_STRING) {
      si->funcname = (SQChar *)&((pSVar4->_name).super_SQObject._unVal.pTable)->_firstfree;
    }
  }
  else {
    if (SVar2 != OT_CLOSURE) {
      return 0;
    }
    this = ((pCVar1->_closure).super_SQObject._unVal.pClosure)->_function;
    if ((this->_name).super_SQObject._type == OT_STRING) {
      si->funcname = (SQChar *)&((this->_name).super_SQObject._unVal.pTable)->_firstfree;
    }
    if ((this->_sourcename).super_SQObject._type == OT_STRING) {
      si->source = (SQChar *)&((this->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
    }
    SVar5 = SQFunctionProto::GetLine(this,pCVar1->_ip);
  }
  si->line = SVar5;
  return 0;
}

Assistant:

SQRESULT sq_stackinfos(HSQUIRRELVM v, SQInteger level, SQStackInfos *si)
{
    SQInteger cssize = v->_callsstacksize;
    if (cssize > level) {
        memset(si, 0, sizeof(SQStackInfos));
        SQVM::CallInfo &ci = v->_callsstack[cssize-level-1];
        switch (type(ci._closure)) {
        case OT_CLOSURE:{
            SQFunctionProto *func = _closure(ci._closure)->_function;
            if (type(func->_name) == OT_STRING)
                si->funcname = _stringval(func->_name);
            if (type(func->_sourcename) == OT_STRING)
                si->source = _stringval(func->_sourcename);
            si->line = func->GetLine(ci._ip);
                        }
            break;
        case OT_NATIVECLOSURE:
            si->source = _SC("NATIVE");
            si->funcname = _SC("unknown");
            if(type(_nativeclosure(ci._closure)->_name) == OT_STRING)
                si->funcname = _stringval(_nativeclosure(ci._closure)->_name);
            si->line = -1;
            break;
        default: break; //shutup compiler
        }
        return SQ_OK;
    }
    return SQ_ERROR;
}